

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

Test * DyndepParserTestMissingVersionBuild::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x218);
  DyndepParserTestMissingVersionBuild((DyndepParserTestMissingVersionBuild *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DyndepParserTest, MissingVersionBuild) {
  const char kInput[] =
"build out: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: expected 'ninja_dyndep_version = ...'\n", err);
}